

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O1

bool cvui::internal::inputUpdateFocus(int theX,int theY,String *theName,Rect *theRect)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  
  if (DAT_001257b0 == (char *)theName->_M_string_length) {
    if (DAT_001257b0 == (char *)0x0) {
      bVar3 = true;
    }
    else {
      iVar1 = bcmp(gInput,(theName->_M_dataplus)._M_p,(size_t)DAT_001257b0);
      bVar3 = iVar1 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  iVar1 = iarea(theX,theY,theRect->width,theRect->height);
  iVar2 = iarea(0,0,10000000,10000000);
  if (iVar1 == 3 && bVar3 == false) {
    std::__cxx11::string::_M_assign((string *)&gInput);
    bVar3 = true;
  }
  else if (((iVar1 != 3) && (iVar2 == 3)) && (bVar3 == true)) {
    bVar3 = false;
    std::__cxx11::string::_M_replace(0x1257a8,0,DAT_001257b0,0x11e74d);
  }
  return bVar3;
}

Assistant:

bool inputUpdateFocus(int theX, int theY, const cv::String& theName, cv::Rect &theRect) {
		bool aFocused = gInput.name == theName;

        int aInputAreaInteraction = cvui::iarea(theX, theY, theRect.width, theRect.height);
		int aOutsideAreaInteraction = cvui::iarea(0, 0, 10000000, 10000000);
        bool aIsGainFocusInteraction = aInputAreaInteraction == cvui::CLICK;
        bool aIsLoseFocusInteraction = aOutsideAreaInteraction == cvui::CLICK;

		if (!aFocused && aIsGainFocusInteraction) {
            gInput.name = theName;
			aFocused = true;
		} else if (aFocused && aIsLoseFocusInteraction && !aIsGainFocusInteraction) {
            gInput.name = "";
			aFocused = false;
		}

        return aFocused;
    }